

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuasispeciesEdgeCalculator.cpp
# Opt level: O0

double __thiscall
QuasispeciesEdgeCalculator::singleOverlap
          (QuasispeciesEdgeCalculator *this,AlignmentRecord *ap1,AlignmentRecord *ap2,int strain1,
          int strain2,double MIN_OVERLAP,double cutoff)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  ulong uVar4;
  size_t sVar5;
  size_type sVar6;
  reference pvVar7;
  mapped_type_conflict *pmVar8;
  int in_ECX;
  AlignmentRecord *in_RDX;
  AlignmentRecord *in_RSI;
  QuasispeciesEdgeCalculator *in_RDI;
  int in_R8D;
  bool bVar9;
  double in_XMM0_Qa;
  double dVar10;
  double in_XMM1_Qa;
  int j_global_2;
  int j_global_1;
  double sum;
  double anti_q_x2;
  double anti_q_x1;
  double q_x2;
  double q_x1;
  int j_global;
  int _;
  int j_prefix;
  int j2;
  int j;
  unsigned_long j_cigar2;
  unsigned_long j_cigar;
  unsigned_long j_seq2;
  unsigned_long j_seq;
  bool perfect;
  double total_size;
  double hamming;
  char alphabet [4];
  double overlap_probability;
  int offset_deletion2_;
  int offset_deletion1_;
  int overlap;
  int offset2;
  int offset1;
  vector<char,_std::allocator<char>_> cigar2;
  ShortDnaSequence sequence2;
  int s2;
  int e2;
  vector<char,_std::allocator<char>_> cigar1;
  ShortDnaSequence sequence1;
  int s1;
  int e1;
  ShortDnaSequence *in_stack_fffffffffffffba8;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *this_00;
  ShortDnaSequence *in_stack_fffffffffffffbb0;
  ShortDnaSequence *this_01;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  const_iterator in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd7;
  bool bVar11;
  ShortDnaSequence *in_stack_fffffffffffffbe0;
  ShortDnaSequence *in_stack_fffffffffffffbe8;
  ShortDnaSequence *in_stack_fffffffffffffbf0;
  bool local_401;
  double local_3d8;
  double local_3c0;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  double local_398;
  double local_388;
  double local_370;
  double local_360;
  double local_348;
  bool local_2cd;
  _Self local_228;
  _Self local_220;
  _Self local_218;
  _Self local_210;
  int local_204;
  _Self local_200;
  _Self local_1f8;
  _Self local_1f0;
  _Self local_1e8;
  int local_1dc;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  _Self local_1b0;
  _Self local_1a8;
  _Self local_1a0;
  _Self local_198;
  int local_18c;
  undefined4 local_188;
  int local_184;
  int local_180;
  int local_17c;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  byte local_151;
  double local_150;
  undefined8 local_148;
  undefined4 local_13c;
  double local_138;
  undefined4 local_130;
  undefined4 local_12c;
  undefined4 local_128;
  undefined1 local_124 [8];
  int local_11c;
  vector<char,_std::allocator<char>_> local_118 [4];
  uint local_a8;
  uint local_a4;
  vector<char,_std::allocator<char>_> local_a0 [4];
  uint local_40;
  uint local_3c;
  double local_38;
  double local_30;
  int local_28;
  int local_24;
  AlignmentRecord *local_20;
  AlignmentRecord *local_18;
  double local_8;
  
  local_3c = 0;
  local_40 = 0;
  local_38 = in_XMM1_Qa;
  local_30 = in_XMM0_Qa;
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  ShortDnaSequence::ShortDnaSequence(in_stack_fffffffffffffbe0);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x261b00);
  local_a4 = 0;
  local_a8 = 0;
  ShortDnaSequence::ShortDnaSequence(in_stack_fffffffffffffbe0);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x261b32);
  if (local_24 == 1) {
    local_40 = AlignmentRecord::getStart1(local_18);
    local_3c = AlignmentRecord::getEnd1(local_18);
    AlignmentRecord::getSequence1(local_18);
    ShortDnaSequence::operator=(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    AlignmentRecord::getCigar1Unrolled(local_18);
    std::vector<char,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffc50,
               (vector<char,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
  }
  else if (local_24 == 2) {
    local_40 = AlignmentRecord::getStart2(local_18);
    local_3c = AlignmentRecord::getEnd2(local_18);
    AlignmentRecord::getSequence2(local_18);
    ShortDnaSequence::operator=(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    AlignmentRecord::getCigar2Unrolled(local_18);
    std::vector<char,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffc50,
               (vector<char,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
  }
  if (local_28 == 1) {
    local_a8 = AlignmentRecord::getStart1(local_20);
    local_a4 = AlignmentRecord::getEnd1(local_20);
    AlignmentRecord::getSequence1(local_20);
    ShortDnaSequence::operator=(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    AlignmentRecord::getCigar1Unrolled(local_20);
    std::vector<char,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffc50,
               (vector<char,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
  }
  else if (local_28 == 2) {
    local_a8 = AlignmentRecord::getStart2(local_20);
    local_a4 = AlignmentRecord::getEnd2(local_20);
    AlignmentRecord::getSequence2(local_20);
    ShortDnaSequence::operator=(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    AlignmentRecord::getCigar2Unrolled(local_20);
    std::vector<char,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffc50,
               (vector<char,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
  }
  if ((int)local_a8 < (int)local_40) {
    std::swap<int>((int *)&local_40,(int *)&local_a8);
    std::swap<int>((int *)&local_3c,(int *)&local_a4);
    std::swap<ShortDnaSequence>(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    std::swap<char,std::allocator<char>>
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffbb0,
               (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffba8);
  }
  local_11c = 0;
  local_124._4_4_ = 0;
  local_124._0_4_ = 0;
  this_01 = (ShortDnaSequence *)local_124;
  this_00 = (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
            (local_124 + 4);
  computeOffsets(in_RDI,local_40,local_a8,local_3c,local_a4,&local_11c,(int *)this_00,(int *)this_01
                );
  if (local_30 <= (double)(int)local_124._0_4_) {
    local_12c = 0;
    local_130 = 0;
    local_138 = 0.0;
    local_13c = 0x54474341;
    local_148 = 0;
    local_150 = 0.0;
    uVar4 = (ulong)local_11c;
    sVar5 = ShortDnaSequence::size((ShortDnaSequence *)0x261fc5);
    if ((uVar4 < sVar5) &&
       (uVar4 = (ulong)(int)local_124._4_4_,
       sVar5 = ShortDnaSequence::size((ShortDnaSequence *)0x262001), uVar4 < sVar5)) {
      local_151 = local_38 == 1.0;
      local_160 = 0;
      local_168 = 0;
      local_170 = 0;
      local_178 = 0;
      local_17c = 0;
      local_180 = 0;
      while( true ) {
        do {
          do {
            uVar1 = local_170;
            sVar6 = std::vector<char,_std::allocator<char>_>::size(local_a0);
            uVar4 = local_178;
          } while (sVar6 <= uVar1);
          sVar6 = std::vector<char,_std::allocator<char>_>::size(local_118);
        } while (sVar6 <= uVar4);
        pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_a0,local_170);
        if ((((*pvVar7 != 'S') &&
             (pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_118,local_178),
             *pvVar7 != 'S')) &&
            (pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_a0,local_170),
            *pvVar7 != 'H')) &&
           (pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_118,local_178),
           *pvVar7 != 'H')) break;
        pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_a0,local_170);
        if (*pvVar7 == 'S') {
          local_170 = local_170 + 1;
          local_160 = local_160 + 1;
        }
        pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_118,local_178);
        if (*pvVar7 == 'S') {
          local_178 = local_178 + 1;
          local_168 = local_168 + 1;
        }
        pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_a0,local_170);
        if (*pvVar7 == 'H') {
          local_170 = local_170 + 1;
        }
        pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_118,local_178);
        if (*pvVar7 == 'H') {
          local_178 = local_178 + 1;
        }
      }
      local_184 = 0;
      while (uVar4 = local_170, local_184 != local_11c) {
        sVar6 = std::vector<char,_std::allocator<char>_>::size(local_a0);
        if (uVar4 < sVar6) {
          pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_a0,local_170);
          if (*pvVar7 == 'I') {
LAB_0026247b:
            local_160 = local_160 + 1;
          }
          else if (*pvVar7 == 'M') {
            if ((local_151 & 1) == 0) {
              local_18c = local_40 + local_17c;
              local_198._M_node =
                   (_Base_ptr)
                   std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::begin(this_00);
              local_1a0._M_node =
                   (_Base_ptr)
                   std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::end(this_00);
              bVar9 = std::operator!=(&local_198,&local_1a0);
              local_2cd = false;
              if (bVar9) {
                local_1a8._M_node =
                     (_Base_ptr)
                     std::
                     map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     ::find(this_00,(key_type *)0x2623c6);
                local_1b0._M_node =
                     (_Base_ptr)
                     std::
                     map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     ::end(this_00);
                local_2cd = std::operator!=(&local_1a8,&local_1b0);
              }
              if (local_2cd != false) {
                pmVar8 = std::
                         map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         ::at((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                               *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
                              (key_type *)in_stack_fffffffffffffbc8._M_node);
                dVar10 = log(*pmVar8);
                local_138 = dVar10 + local_138;
              }
            }
            local_17c = local_17c + 1;
            goto LAB_0026247b;
          }
          local_170 = local_170 + 1;
          local_184 = local_184 + 1;
        }
        else {
          local_188 = 0;
          local_170 = local_170 + 1;
          local_184 = local_184 + 1;
        }
      }
      while( true ) {
        while( true ) {
          uVar1 = local_170;
          sVar6 = std::vector<char,_std::allocator<char>_>::size(local_a0);
          uVar4 = local_178;
          bVar9 = false;
          if (uVar1 < sVar6) {
            sVar6 = std::vector<char,_std::allocator<char>_>::size(local_118);
            bVar9 = false;
            if (uVar4 < sVar6) {
              pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_a0,local_170);
              bVar9 = false;
              if (*pvVar7 != 'S') {
                pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_118,local_178);
                uVar4 = local_160;
                bVar9 = false;
                if (*pvVar7 != 'S') {
                  sVar5 = ShortDnaSequence::size((ShortDnaSequence *)0x2625a2);
                  uVar1 = local_168;
                  bVar9 = false;
                  if (uVar4 < sVar5) {
                    sVar5 = ShortDnaSequence::size((ShortDnaSequence *)0x2625e7);
                    bVar9 = uVar1 < sVar5;
                  }
                }
              }
            }
          }
          uVar4 = local_170;
          if (!bVar9) {
            if ((local_151 & 1) == 0) {
              sVar6 = std::vector<char,_std::allocator<char>_>::size(local_a0);
              if ((uVar4 < sVar6) &&
                 (pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_a0,local_170),
                 *pvVar7 != 'S')) {
                while ((uVar4 = local_170,
                       sVar6 = std::vector<char,_std::allocator<char>_>::size(local_a0),
                       uVar4 < sVar6 &&
                       (pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                                           (local_a0,local_170), *pvVar7 != 'S'))) {
                  pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_a0,local_170);
                  if (*pvVar7 == 'M') {
                    local_1dc = local_40 + local_17c;
                    local_1e8._M_node =
                         (_Base_ptr)
                         std::
                         map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         ::begin(this_00);
                    local_1f0._M_node =
                         (_Base_ptr)
                         std::
                         map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         ::end(this_00);
                    bVar9 = std::operator!=(&local_1e8,&local_1f0);
                    local_401 = false;
                    if (bVar9) {
                      local_1f8._M_node =
                           (_Base_ptr)
                           std::
                           map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           ::find(this_00,(key_type *)0x2630c1);
                      local_200._M_node =
                           (_Base_ptr)
                           std::
                           map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           ::end(this_00);
                      local_401 = std::operator!=(&local_1f8,&local_200);
                    }
                    if (local_401 != false) {
                      pmVar8 = std::
                               map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                               ::at((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                     *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0)
                                    ,(key_type *)in_stack_fffffffffffffbc8._M_node);
                      dVar10 = log(*pmVar8);
                      local_138 = dVar10 + local_138;
                    }
                    local_17c = local_17c + 1;
                  }
                  local_170 = local_170 + 1;
                }
              }
              else {
                uVar4 = local_178;
                sVar6 = std::vector<char,_std::allocator<char>_>::size(local_118);
                if ((uVar4 < sVar6) &&
                   (pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                                       (local_118,local_178), *pvVar7 != 'S')) {
                  while ((uVar4 = local_178,
                         sVar6 = std::vector<char,_std::allocator<char>_>::size(local_118),
                         uVar4 < sVar6 &&
                         (pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                                             (local_118,local_178), *pvVar7 != 'S'))) {
                    pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                                       (local_118,local_178);
                    if (*pvVar7 == 'M') {
                      local_204 = local_a8 + local_180;
                      local_210._M_node =
                           (_Base_ptr)
                           std::
                           map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           ::begin(this_00);
                      local_218._M_node =
                           (_Base_ptr)
                           std::
                           map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           ::end(this_00);
                      bVar9 = std::operator!=(&local_210,&local_218);
                      bVar11 = false;
                      if (bVar9) {
                        in_stack_fffffffffffffbc8 =
                             std::
                             map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             ::find(this_00,(key_type *)0x2632c0);
                        local_220._M_node = in_stack_fffffffffffffbc8._M_node;
                        local_228._M_node =
                             (_Base_ptr)
                             std::
                             map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             ::end(this_00);
                        bVar11 = std::operator!=(&local_220,&local_228);
                      }
                      if (bVar11 != false) {
                        in_stack_fffffffffffffbc0 =
                             (vector<char,_std::allocator<char>_> *)
                             std::
                             map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             ::at((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                   *)CONCAT17(bVar11,in_stack_fffffffffffffbd0),
                                  (key_type *)in_stack_fffffffffffffbc8._M_node);
                        dVar10 = log(*(double *)
                                      &(in_stack_fffffffffffffbc0->
                                       super__Vector_base<char,_std::allocator<char>_>)._M_impl);
                        local_138 = dVar10 + local_138;
                      }
                      local_180 = local_180 + 1;
                    }
                    local_178 = local_178 + 1;
                  }
                }
              }
            }
            if ((local_151 & 1) == 0) {
              dVar10 = exp(local_138);
              local_8 = pow(dVar10,1.0 / local_150);
            }
            else {
              local_8 = 1.0;
            }
            goto LAB_002633e0;
          }
          if ((local_151 & 1) != 0) break;
          pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_a0,local_170);
          cVar2 = *pvVar7;
          pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_118,local_178);
          if ((cVar2 == *pvVar7) &&
             ((pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_a0,local_170),
              *pvVar7 == 'M' ||
              (pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_a0,local_170),
              *pvVar7 == 'I')))) {
            local_1b8 = ShortDnaSequence::qualityCorrect(this_01,(size_t)this_00);
            local_1c0 = ShortDnaSequence::qualityCorrect(this_01,(size_t)this_00);
            local_1c8 = (1.0 - local_1b8) / 3.0;
            local_1d0 = (1.0 - local_1c0) / 3.0;
            local_1d8 = 0.0;
            cVar2 = ShortDnaSequence::operator[](this_01,(size_t)this_00);
            if (cVar2 == (char)local_13c) {
              local_348 = local_1b8;
            }
            else {
              local_348 = local_1c8;
            }
            cVar2 = ShortDnaSequence::operator[](this_01,(size_t)this_00);
            if (cVar2 == (char)local_13c) {
              local_360 = local_1c0;
            }
            else {
              local_360 = local_1d0;
            }
            local_1d8 = local_348 * local_360 + local_1d8;
            cVar2 = ShortDnaSequence::operator[](this_01,(size_t)this_00);
            if (cVar2 == local_13c._1_1_) {
              local_370 = local_1b8;
            }
            else {
              local_370 = local_1c8;
            }
            cVar2 = ShortDnaSequence::operator[](this_01,(size_t)this_00);
            if (cVar2 == local_13c._1_1_) {
              local_388 = local_1c0;
            }
            else {
              local_388 = local_1d0;
            }
            local_1d8 = local_370 * local_388 + local_1d8;
            cVar2 = ShortDnaSequence::operator[](this_01,(size_t)this_00);
            if (cVar2 == local_13c._2_1_) {
              local_398 = local_1b8;
            }
            else {
              local_398 = local_1c8;
            }
            cVar2 = ShortDnaSequence::operator[](this_01,(size_t)this_00);
            dVar10 = local_1d0;
            if (cVar2 == local_13c._2_1_) {
              dVar10 = local_1c0;
            }
            local_1d8 = local_398 * dVar10 + local_1d8;
            cVar2 = ShortDnaSequence::operator[](this_01,(size_t)this_00);
            if (cVar2 == local_13c._3_1_) {
              local_3c0 = local_1b8;
            }
            else {
              local_3c0 = local_1c8;
            }
            cVar2 = ShortDnaSequence::operator[](this_01,(size_t)this_00);
            if (cVar2 == local_13c._3_1_) {
              local_3d8 = local_1c0;
            }
            else {
              local_3d8 = local_1d0;
            }
            local_1d8 = local_3c0 * local_3d8 + local_1d8;
            dVar10 = log(local_1d8);
            local_138 = dVar10 + local_138;
            local_150 = local_150 + 1.0;
            uVar4 = local_170 + 1;
            local_178 = local_178 + 1;
            local_160 = local_160 + 1;
            local_168 = local_168 + 1;
            local_170 = uVar4;
            sVar6 = std::vector<char,_std::allocator<char>_>::size(local_a0);
            if ((uVar4 < sVar6) &&
               (pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_a0,local_170),
               *pvVar7 == 'M')) {
              local_17c = local_17c + 1;
              local_180 = local_180 + 1;
            }
          }
          else {
            pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_a0,local_170);
            cVar2 = *pvVar7;
            pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_118,local_178);
            if ((cVar2 == *pvVar7) &&
               (pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_a0,local_170),
               *pvVar7 == 'D')) {
              local_170 = local_170 + 1;
              local_178 = local_178 + 1;
            }
            else {
              if ((in_RDI->FRAMESHIFT_MERGE & 1U) == 0) {
                local_8 = 0.0;
                goto LAB_002633e0;
              }
              pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_118,local_178);
              if (*pvVar7 == 'M') {
                pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_a0,local_170);
                if (*pvVar7 == 'D') {
                  local_170 = local_170 + 1;
                  local_178 = local_178 + 1;
                  local_168 = local_168 + 1;
                  local_180 = local_180 + 1;
                }
                else if (*pvVar7 == 'I') {
                  local_170 = local_170 + 1;
                  local_160 = local_160 + 1;
                }
              }
              else {
                pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_a0,local_170);
                if (*pvVar7 != 'M') {
                  local_8 = 0.0;
                  goto LAB_002633e0;
                }
                pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](local_118,local_178);
                if (*pvVar7 == 'D') {
                  local_178 = local_178 + 1;
                  local_170 = local_170 + 1;
                  local_160 = local_160 + 1;
                  local_17c = local_17c + 1;
                }
                else if (*pvVar7 == 'I') {
                  local_178 = local_178 + 1;
                  local_168 = local_168 + 1;
                }
              }
            }
          }
        }
        cVar2 = ShortDnaSequence::operator[](this_01,(size_t)this_00);
        cVar3 = ShortDnaSequence::operator[](this_01,(size_t)this_00);
        if (cVar2 != cVar3) break;
        local_170 = local_170 + 1;
        local_178 = local_178 + 1;
        local_160 = local_160 + 1;
        local_168 = local_168 + 1;
      }
      local_8 = 0.0;
    }
    else {
      local_8 = 0.0;
    }
  }
  else {
    local_8 = 0.0;
  }
LAB_002633e0:
  local_128 = 1;
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffbc0);
  ShortDnaSequence::~ShortDnaSequence(this_01);
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffbc0);
  ShortDnaSequence::~ShortDnaSequence(this_01);
  return local_8;
}

Assistant:

double QuasispeciesEdgeCalculator::singleOverlap(const AlignmentRecord & ap1, const AlignmentRecord & ap2, int strain1, int strain2, double MIN_OVERLAP, const double cutoff) const {
    int e1 = 0;
    int s1 = 0;
    ShortDnaSequence sequence1;
    vector<char> cigar1;

    int e2 = 0;
    int s2 = 0;
    ShortDnaSequence sequence2;
    vector<char> cigar2;

    if (strain1 == 1) {
        s1 = ap1.getStart1();
        e1 = ap1.getEnd1();
        sequence1 = ap1.getSequence1();
        cigar1 = ap1.getCigar1Unrolled();
    } else if (strain1 == 2) {
        s1 = ap1.getStart2();
        e1 = ap1.getEnd2();
        sequence1 = ap1.getSequence2();
        cigar1 = ap1.getCigar2Unrolled();
    }
    if (strain2 == 1) {
        s2 = ap2.getStart1();
        e2 = ap2.getEnd1();
        sequence2 = ap2.getSequence1();
        cigar2 = ap2.getCigar1Unrolled();
    } else if (strain2 == 2) {
        s2 = ap2.getStart2();
        e2 = ap2.getEnd2();
        sequence2 = ap2.getSequence2();
        cigar2 = ap2.getCigar2Unrolled();
    }

    if (s2 < s1) {
        std::swap(s1,s2);
        std::swap(e1,e2);
        std::swap(sequence1,sequence2);
        std::swap(cigar1,cigar2);
    }

    // ====
    // compute overlap
    int offset1 = 0;
    int offset2 = 0;
    int overlap = 0;
    computeOffsets(s1, s2, e1, e2, offset1, offset2, overlap);

    if (offset2 > 0) {
        //cerr << "offset 2: " << offset2 << endl;
    }
    //cerr << "offset 1: " << offset1 << endl;
    //cerr << "offset 2: " << offset2 << endl;
    //cerr << "single overlap: " << overlap << endl;
    if (overlap < MIN_OVERLAP) {
        return 0;
    }

    // ====
    //Offsets for the deletions and insertions that occured
    //upstream of the overlap. They cause index errors if not fixed.
    int offset_deletion1_ = 0;
    int offset_deletion2_ = 0;

    double overlap_probability = 0.0;
    char alphabet[] = {'A', 'C', 'G', 'T'};
    double hamming = 0;
    double total_size = 0;
    if (offset1 >= sequence1.size() || offset2 >= sequence2.size()) {
        return 0;
    }
    ////cerr << offset1 << " offset " << offset2 << endl;
    bool perfect = cutoff == 1.0;

    unsigned long j_seq = 0, j_seq2 = 0;
    unsigned long j_cigar = 0, j_cigar2 = 0;
    int j = 0, j2 = 0;
    for (;;) {
        if(j_cigar < cigar1.size() && j_cigar2 < cigar2.size()) {

            if (cigar1[j_cigar] != 'S' && cigar2[j_cigar2] != 'S' && cigar1[j_cigar] != 'H' && cigar2[j_cigar2] != 'H') break;
            if (cigar1[j_cigar] == 'S') { j_cigar++; j_seq++; }
            if (cigar2[j_cigar2] == 'S') { j_cigar2++; j_seq2++; }
            if (cigar1[j_cigar] == 'H') { j_cigar++; }
            if (cigar2[j_cigar2] == 'H') { j_cigar2++; }
        }
    }
    for (int j_prefix = 0;;) {
        if (j_prefix == offset1) break;
        if(j_cigar >= cigar1.size()) {
            int _ = 0;
            j_cigar++;
            j_prefix++;
            continue;
        }
        switch (cigar1[j_cigar]) {
            case 'M': 
                if (!perfect) {
                    int j_global = s1+j;
                    if (this->SIMPSON_MAP.begin() != this->SIMPSON_MAP.end()
                        && this->SIMPSON_MAP.find(j_global) != this->SIMPSON_MAP.end()) {
                        overlap_probability += log(this->SIMPSON_MAP.at(j_global));
                        //cerr << overlap_probability << endl;
                    }
                }
                j++;
            case 'I':
                j_seq++;
            default: break;
        }
        j_cigar++;
        j_prefix++;
    }
    for (;j_cigar<cigar1.size() && j_cigar2<cigar2.size() && cigar1[j_cigar] != 'S' && cigar2[j_cigar2] != 'S' && j_seq < sequence1.size() && j_seq2 < sequence2.size();) {
        //cerr << cigar1[j_cigar] << cigar2[j_cigar2] << "\t"; 
        if (perfect) {
            if (sequence1[j_seq] != sequence2[j_seq2]) return 0;
            else {
                j_cigar++;
                j_cigar2++;
                j_seq++;
                j_seq2++;
            }
        } else if (cigar1[j_cigar] == cigar2[j_cigar2] && (cigar1[j_cigar] == 'M' || cigar1[j_cigar] == 'I')) {

            //cerr << sequence1[j_seq] << ":" << sequence2[j_seq2];
            double q_x1 = sequence1.qualityCorrect(j_seq);
            // if (q_x1 < 0.001) {
            //     q_x1 = 0.001;
            // }
            double q_x2 = sequence2.qualityCorrect(j_seq2);
            // if (q_x2 < 0.001) {
            //     q_x2 = 0.001;
            // }
            //cerr << "\t" << q_x1 << ":" << q_x2 << "\t";
            double anti_q_x1 = (1.0 - q_x1) / 3.0;
            double anti_q_x2 = (1.0 - q_x2) / 3.0;
            assert(q_x1 <= 1 && q_x2 <= 1);
            double sum = 0.0;
            sum += ((sequence1[j_seq] == alphabet[0] ? q_x1 : anti_q_x1) * (sequence2[j_seq2] == alphabet[0] ? q_x2 : anti_q_x2));
            sum += ((sequence1[j_seq] == alphabet[1] ? q_x1 : anti_q_x1) * (sequence2[j_seq2] == alphabet[1] ? q_x2 : anti_q_x2));
            sum += ((sequence1[j_seq] == alphabet[2] ? q_x1 : anti_q_x1) * (sequence2[j_seq2] == alphabet[2] ? q_x2 : anti_q_x2));
            sum += ((sequence1[j_seq] == alphabet[3] ? q_x1 : anti_q_x1) * (sequence2[j_seq2] == alphabet[3] ? q_x2 : anti_q_x2));
            overlap_probability += log(sum);
            //cerr << "\t" << overlap_probability;
            total_size++;

            //cerr << sum << "\t";
            //cerr << ((sequence1[j_seq] == alphabet[0] ? q_x1 : anti_q_x1)) << ":" << ((sequence2[j_seq2] == alphabet[0] ? q_x2 : anti_q_x2)) << "\t";
            //cerr << ((sequence1[j_seq] == alphabet[1] ? q_x1 : anti_q_x1)) << ":" << ((sequence2[j_seq2] == alphabet[1] ? q_x2 : anti_q_x2)) << "\t";
            //cerr << ((sequence1[j_seq] == alphabet[2] ? q_x1 : anti_q_x1)) << ":" << ((sequence2[j_seq2] == alphabet[2] ? q_x2 : anti_q_x2)) << "\t";
            //cerr << ((sequence1[j_seq] == alphabet[3] ? q_x1 : anti_q_x1)) << ":" << ((sequence2[j_seq2] == alphabet[3] ? q_x2 : anti_q_x2)) << "\t";

            j_cigar++;
            j_cigar2++;
            j_seq++;
            j_seq2++;

            if (j_cigar < cigar1.size() && cigar1[j_cigar] == 'M') {
                j++;
                j2++;
            } 
        } else if (cigar1[j_cigar] == cigar2[j_cigar2] && cigar1[j_cigar] == 'D') {
            j_cigar++;
            j_cigar2++;
        }else if (this->FRAMESHIFT_MERGE) {
            if (cigar2[j_cigar2] == 'M') {
                switch(cigar1[j_cigar]) {
                    case 'D':
                        //cerr << "-:" << sequence2[j_seq2];  
                        j_cigar++;
                        j_cigar2++;
                        j_seq2++;
                        j2++;
                        break;
                    case 'I':
                        //cerr << sequence1[j_seq] << ":-";  
                        j_cigar++;
                        j_seq++;
                        break;
                    default: break;
                }
            } else if (cigar1[j_cigar] == 'M') {
                switch(cigar2[j_cigar2]) {
                    case 'D':
                        //cerr << sequence1[j_seq] << ":-";  
                        j_cigar2++;
                        j_cigar++;
                        j_seq++;
                        j++;
                        break;
                    case 'I':
                        //cerr << "-:" << sequence2[j_seq2];  
                        j_cigar2++;
                        j_seq2++;
                        break;
                }
            } else {
                //cerr << "DOES NOT MATCH" << endl;
                return 0;
            }
        } else {
            return 0;
        }
        //cerr << endl;
    }
    if (!perfect) {
        if (j_cigar < cigar1.size() && cigar1[j_cigar] != 'S') {
            for (;j_cigar<cigar1.size();) {
                if (cigar1[j_cigar] == 'S') break;
                if (cigar1[j_cigar] == 'M') {
                    int j_global = s1+j;
                    if (this->SIMPSON_MAP.begin() != this->SIMPSON_MAP.end()
                        && this->SIMPSON_MAP.find(j_global) != this->SIMPSON_MAP.end()) {
                        overlap_probability += log(this->SIMPSON_MAP.at(j_global));
                        //cerr << overlap_probability << endl;
                    }
                    j++;
                }
                j_cigar++;
            }
        } else if (j_cigar2 < cigar2.size() && cigar2[j_cigar2] != 'S') {
            for (;j_cigar2<cigar2.size();) {
                if (cigar2[j_cigar2] == 'S') break;
                if (cigar2[j_cigar2] == 'M') {
                    //if (j_cigar >= 26){
                    //    cerr << s2 << endl;
                    //    cerr << j2 << endl;
                    //    cerr << s2+j2 << endl;
                    //}
                    int j_global = s2+j2;
                    if (this->SIMPSON_MAP.begin() != this->SIMPSON_MAP.end()
                        && this->SIMPSON_MAP.find(j_global) != this->SIMPSON_MAP.end()) {
                        overlap_probability += log(this->SIMPSON_MAP.at(j_global));
                        //cerr << overlap_probability << endl;
                    }
                    j2++;
                }
                j_cigar2++;
            }
        }
    }
    //cerr << pow(exp(overlap_probability),1.0/total_size) << endl;
    if (perfect) return 1;
    return pow(exp(overlap_probability),1.0/total_size);
}